

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_cdef(lua_State *L)

{
  int errcode;
  ulong uVar1;
  CPState cp;
  CPState CStack_78;
  
  CStack_78.p = (char *)lj_lib_checkstr(L,1);
  CStack_78.cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  (CStack_78.cts)->L = L;
  CStack_78.p = (char *)((long)CStack_78.p + 0x10);
  CStack_78.param = L->base + 1;
  CStack_78.mode = 5;
  CStack_78.L = L;
  CStack_78.srcname = CStack_78.p;
  errcode = lj_cparse(&CStack_78);
  if (errcode == 0) {
    uVar1 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar1 + 0x54) <= *(uint *)(uVar1 + 0x50)) {
      lj_gc_step(L);
    }
    return 0;
  }
  lj_err_throw(L,errcode);
}

Assistant:

LJLIB_CF(ffi_cdef)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  CPState cp;
  int errcode;
  cp.L = L;
  cp.cts = ctype_cts(L);
  cp.srcname = strdata(s);
  cp.p = strdata(s);
  cp.param = L->base+1;
  cp.mode = CPARSE_MODE_MULTI|CPARSE_MODE_DIRECT;
  errcode = lj_cparse(&cp);
  if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
  lj_gc_check(L);
  return 0;
}